

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QObject_*(*)()>::resize(QList<QObject_*(*)()> *this,qsizetype size)

{
  _func_QObject_ptr **pp_Var1;
  Data *pDVar2;
  long lVar3;
  _func_QObject_ptr **pp_Var4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<QObject_*(*)()>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(_func_QObject_ptr ***)0x0,
               (QArrayDataPointer<QObject_*(*)()> *)0x0);
  }
  else if (size < (this->d).size) {
    (this->d).size = size;
  }
  lVar3 = (this->d).size;
  if (lVar3 < size) {
    pp_Var4 = (this->d).ptr;
    pp_Var1 = pp_Var4 + lVar3;
    *pp_Var1 = (_func_QObject_ptr *)0x0;
    if (pp_Var1 + 1 != pp_Var4 + size) {
      memset(pp_Var1 + 1,0,(size * 8 + lVar3 * -8) - 8);
    }
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }